

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint8_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  bool bVar5;
  shared_container_t *psVar6;
  ulong uVar7;
  array_container_t *paVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  int iVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  ushort uVar18;
  uint8_t *typecode;
  uint uVar19;
  shared_container_t *psVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  array_container_t *paVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  uint8_t new_type;
  uint8_t local_5d;
  uint local_5c;
  uint local_58;
  uint local_54;
  array_container_t *local_50;
  uint local_44;
  ulong local_40;
  uint local_34;
  
  if (min <= max) {
    uVar17 = min >> 0x10;
    iVar10 = (r->high_low_container).size;
    if (iVar10 == 0) {
      uVar29 = 0;
    }
    else {
      iVar10 = iVar10 + -1;
      uVar12 = 0;
      uVar13 = min;
      do {
        if (iVar10 < (int)uVar12) {
          uVar13 = ~uVar12;
          break;
        }
        uVar28 = uVar12 + iVar10 >> 1;
        uVar18 = *(ushort *)
                  ((long)(r->high_low_container).keys + (ulong)(uVar12 + iVar10 & 0xfffffffe));
        uVar16 = (ushort)(min >> 0x10);
        if (uVar18 < uVar16) {
          uVar12 = uVar28 + 1;
          bVar5 = true;
        }
        else if (uVar16 < uVar18) {
          iVar10 = uVar28 - 1;
          bVar5 = true;
        }
        else {
          bVar5 = false;
          uVar13 = uVar28;
        }
      } while (bVar5);
      uVar29 = (ulong)((int)uVar13 >> 0x1f ^ uVar13);
    }
    iVar10 = (r->high_low_container).size;
    uVar22 = uVar29;
    if ((int)uVar29 < iVar10) {
      uVar33 = (ulong)(int)uVar29;
      uVar18 = (r->high_low_container).keys[uVar33];
      uVar12 = (uint)uVar18;
      if ((uint)uVar18 <= max >> 0x10) {
        uVar28 = min & 0xffff;
        uVar30 = max & 0xffff;
        local_5c = uVar17;
        local_58 = uVar30;
        local_54 = uVar28;
        local_44 = max >> 0x10;
        local_40 = uVar29;
        do {
          psVar20 = (shared_container_t *)(ulong)local_44;
          uVar24 = 0;
          if (uVar17 == uVar12) {
            uVar24 = uVar28;
          }
          uVar29 = 0xffff;
          if (local_44 == uVar12) {
            uVar29 = (ulong)uVar30;
          }
          uVar22 = uVar33 & 0xffff;
          typecode = (r->high_low_container).typecodes;
          psVar6 = (shared_container_t *)(r->high_low_container).containers[uVar22];
          if (typecode[uVar22] == '\x04') {
            typecode = typecode + uVar22;
            psVar20 = psVar6;
            psVar6 = (shared_container_t *)shared_container_extract_copy(psVar6,typecode);
          }
          uVar28 = local_54;
          uVar17 = local_5c;
          (r->high_low_container).containers[uVar22] = psVar6;
          paVar25 = (array_container_t *)(r->high_low_container).containers[uVar33];
          uVar1 = (r->high_low_container).typecodes[uVar33];
          uVar16 = (ushort)uVar29;
          uVar12 = (uint)uVar29;
          uVar18 = (ushort)uVar24;
          if (uVar1 == '\x03') {
            iVar10 = paVar25->cardinality;
            lVar26 = (long)iVar10;
            if ((lVar26 == 0) ||
               ((prVar3 = (rle16_t *)paVar25->array, uVar24 <= prVar3->value &&
                ((ushort)(prVar3[lVar26 + -1].length + prVar3[lVar26 + -1].value) <= uVar12)))) {
              paVar8 = (array_container_t *)0x0;
            }
            else {
              iVar14 = iVar10 + -1;
              uVar11 = 0;
              iVar32 = iVar14;
              do {
                if (iVar32 < (int)uVar11) {
                  uVar11 = ~uVar11;
                  uVar22 = (ulong)uVar11;
                  break;
                }
                uVar23 = uVar11 + iVar32 >> 1;
                if ((ushort)(prVar3[uVar23].length + prVar3[uVar23].value) < uVar18) {
                  uVar11 = uVar23 + 1;
                  bVar5 = true;
                }
                else if (uVar18 < prVar3[uVar23].value) {
                  iVar32 = uVar23 - 1;
                  bVar5 = true;
                }
                else {
                  bVar5 = false;
                  uVar22 = (ulong)uVar23;
                }
              } while (bVar5);
              uVar31 = (uint)uVar22;
              uVar23 = 0;
              do {
                if (iVar14 < (int)uVar23) {
                  uVar11 = ~uVar23;
                  break;
                }
                uVar19 = uVar23 + iVar14 >> 1;
                if ((ushort)(prVar3[uVar19].length + prVar3[uVar19].value) < uVar16) {
                  uVar23 = uVar19 + 1;
                  bVar5 = true;
                }
                else if (uVar16 < prVar3[uVar19].value) {
                  iVar14 = uVar19 - 1;
                  bVar5 = true;
                }
                else {
                  bVar5 = false;
                  uVar11 = uVar19;
                }
              } while (bVar5);
              if ((int)uVar31 < 0) {
                uVar31 = ~uVar31;
LAB_00104375:
                if ((int)uVar11 < 0) {
                  uVar11 = -uVar11 - 2;
                }
                else {
                  uVar18 = prVar3[uVar11].length + prVar3[uVar11].value;
                  if (uVar12 < uVar18) {
                    prVar3[uVar11].value = uVar16 + 1;
                    prVar3[uVar11].length = uVar18 - (uVar16 + 1);
                    uVar11 = uVar11 - 1;
                  }
                }
                if ((int)uVar31 <= (int)uVar11) {
                  iVar10 = iVar10 + ~uVar11;
                  iVar32 = uVar31 + ~uVar11;
                  if ((0 < iVar32) && (paVar25->capacity < iVar32 + iVar10)) {
                    local_50 = paVar25;
                    run_container_grow((run_container_t *)paVar25,iVar32 + iVar10,true);
                    paVar25 = local_50;
                  }
                  lVar26 = (long)paVar25->cardinality - (long)iVar10;
                  memmove((rle16_t *)paVar25->array + ((int)lVar26 + iVar32),
                          (rle16_t *)paVar25->array + lVar26,(long)iVar10 << 2);
                  paVar25->cardinality = paVar25->cardinality + iVar32;
                  uVar30 = local_58;
                }
              }
              else {
                uVar2 = prVar3[uVar22].value;
                uVar30 = local_58;
                if (uVar24 <= uVar2) goto LAB_00104375;
                if ((uint)prVar3[uVar22].length + (uint)uVar2 <= uVar12) {
                  prVar3[uVar22].length = uVar18 + ~uVar2;
                  uVar31 = uVar31 + 1;
                  goto LAB_00104375;
                }
                local_50 = paVar25;
                if (paVar25->capacity <= iVar10) {
                  run_container_grow((run_container_t *)paVar25,iVar10 + 1,true);
                }
                uVar29 = (long)(int)uVar31 + 1U & 0xffff;
                memmove((rle16_t *)local_50->array + uVar29 + 1,(rle16_t *)local_50->array + uVar29,
                        ((long)local_50->cardinality - uVar29) * 4);
                local_50->cardinality = local_50->cardinality + 1;
                prVar3 = (rle16_t *)local_50->array;
                uVar29 = (long)(int)uVar31 + 1U & 0xffffffff;
                prVar3[uVar29].value = uVar16 + 1;
                uVar2 = prVar3[uVar22].value;
                prVar3[uVar29].length = ~uVar16 + uVar2 + prVar3[uVar22].length;
                prVar3[uVar22].length = uVar18 + ~uVar2;
                paVar25 = local_50;
                uVar28 = local_54;
                uVar30 = local_58;
                uVar17 = local_5c;
              }
              paVar8 = (array_container_t *)
                       convert_run_to_efficient_container((run_container_t *)paVar25,&local_5d);
            }
          }
          else if (uVar1 == '\x02') {
            prVar3 = (rle16_t *)paVar25->array;
            uVar12 = paVar25->cardinality;
            uVar11 = 0;
            uVar24 = 0;
            if (uVar12 != 0) {
              iVar10 = uVar12 - 1;
              uVar24 = 0;
              do {
                if (iVar10 < (int)uVar24) {
                  uVar23 = ~uVar24;
                  break;
                }
                uVar23 = uVar24 + iVar10 >> 1;
                uVar2 = *(ushort *)((long)&prVar3->value + (ulong)(uVar24 + iVar10 & 0xfffffffe));
                if (uVar2 < uVar16) {
                  uVar24 = uVar23 + 1;
                  bVar5 = true;
                }
                else if (uVar16 < uVar2) {
                  iVar10 = uVar23 - 1;
                  bVar5 = true;
                }
                else {
                  bVar5 = false;
                  typecode = (uint8_t *)(ulong)uVar23;
                }
                uVar23 = (uint)typecode;
              } while (bVar5);
              psVar20 = (shared_container_t *)(ulong)~uVar23;
              uVar24 = uVar23 + 1;
              if (-1 < (int)uVar23) {
                uVar24 = ~uVar23;
              }
              uVar24 = uVar24 + uVar12;
            }
            if (uVar12 != uVar24) {
              iVar10 = ~uVar24 + uVar12;
              uVar23 = 0;
              do {
                if (iVar10 < (int)uVar23) {
                  uVar11 = ~uVar23;
                  break;
                }
                uVar11 = uVar23 + iVar10 >> 1;
                psVar6 = (shared_container_t *)(ulong)uVar11;
                uVar16 = *(ushort *)((long)&prVar3->value + (ulong)(uVar23 + iVar10 & 0xfffffffe));
                if (uVar16 < uVar18) {
                  uVar23 = uVar11 + 1;
                  bVar5 = true;
                  psVar6 = psVar20;
                }
                else if (uVar18 < uVar16) {
                  iVar10 = uVar11 - 1;
                  bVar5 = true;
                  psVar6 = psVar20;
                }
                else {
                  bVar5 = false;
                }
                uVar11 = (uint)psVar6;
                psVar20 = psVar6;
              } while (bVar5);
              uVar11 = (int)uVar11 >> 0x1f ^ uVar11;
            }
            if (uVar11 + uVar24 == 0) {
              paVar8 = (array_container_t *)0x0;
            }
            else {
              local_5d = '\x02';
              iVar10 = uVar12 - (uVar11 + uVar24);
              paVar8 = paVar25;
              if (iVar10 != 0) {
                memmove(&prVar3->value + uVar11,&prVar3->value + (uVar11 + iVar10),(ulong)uVar24 * 2
                       );
                paVar25->cardinality = paVar25->cardinality - iVar10;
                uVar30 = local_58;
              }
            }
          }
          else {
            prVar3 = (rle16_t *)paVar25->array;
            uVar30 = uVar24 >> 6;
            uVar7 = (ulong)uVar30;
            uVar22 = uVar29 >> 6;
            uVar11 = (uint)uVar22;
            bVar9 = (byte)uVar24;
            bVar27 = (byte)uVar29;
            if (uVar11 == uVar30) {
              uVar29 = *(ulong *)(prVar3 + uVar7 * 2) &
                       (0xffffffffffffffffU >> (~bVar27 + bVar9 & 0x3f)) << (bVar9 & 0x3f);
              uVar29 = uVar29 - (uVar29 >> 1 & 0x5555555555555555);
              uVar29 = (uVar29 >> 2 & 0x3333333333333333) + (uVar29 & 0x3333333333333333);
              uVar23 = (uint)(byte)(((uVar29 >> 4) + uVar29 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38);
            }
            else {
              uVar29 = (*(ulong *)(prVar3 + uVar7 * 2) >> (bVar9 & 0x3f)) << (bVar9 & 0x3f);
              uVar29 = uVar29 - (uVar29 >> 1 & 0x5555555555555555);
              uVar29 = (uVar29 >> 2 & 0x3333333333333333) + (uVar29 & 0x3333333333333333);
              uVar29 = ((uVar29 >> 4) + uVar29 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
              uVar15 = uVar29 >> 0x38;
              uVar23 = (uint)(byte)(uVar29 >> 0x38);
              if (uVar30 + 1 < uVar11) {
                uVar29 = (ulong)(uVar30 + 1);
                do {
                  uVar21 = *(ulong *)(prVar3 + uVar29 * 2) -
                           (*(ulong *)(prVar3 + uVar29 * 2) >> 1 & 0x5555555555555555);
                  uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
                  uVar23 = (int)uVar15 +
                           (uint)(byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) *
                                        0x101010101010101 >> 0x38);
                  uVar15 = (ulong)uVar23;
                  uVar29 = uVar29 + 1;
                } while (uVar22 != uVar29);
              }
              uVar29 = (ulong)(*(long *)(prVar3 + uVar22 * 2) << (~bVar27 & 0x3f)) >>
                       (~bVar27 & 0x3f);
              uVar29 = uVar29 - (uVar29 >> 1 & 0x5555555555555555);
              uVar29 = (uVar29 >> 2 & 0x3333333333333333) + (uVar29 & 0x3333333333333333);
              uVar23 = (byte)(((uVar29 >> 4) + uVar29 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38) + uVar23;
              local_34 = uVar11;
            }
            iVar10 = paVar25->cardinality - uVar23;
            if (iVar10 == 0) {
              paVar8 = (array_container_t *)0x0;
              uVar30 = local_58;
              local_50 = paVar25;
            }
            else if (iVar10 < 0x1001) {
              local_5d = '\x02';
              local_50 = paVar25;
              if (uVar12 + 1 != uVar24) {
                uVar29 = -1L << (bVar9 & 0x3f);
                if (uVar11 - uVar30 == 0) {
                  uVar29 = (uVar29 << (~bVar27 & 0x3f)) >> (~bVar27 & 0x3f);
                  uVar22 = (ulong)uVar30;
                }
                else {
                  *(ulong *)(prVar3 + (ulong)uVar30 * 2) =
                       *(ulong *)(prVar3 + (ulong)uVar30 * 2) & ~uVar29;
                  if (uVar30 + 1 < uVar11) {
                    memset(prVar3 + uVar7 * 2 + 2,0,(ulong)((uVar11 - uVar30) - 2) * 8 + 8);
                  }
                  uVar29 = 0xffffffffffffffff >> (~bVar27 & 0x3f);
                }
                *(ulong *)(prVar3 + uVar22 * 2) = *(ulong *)(prVar3 + uVar22 * 2) & ~uVar29;
              }
              local_50->cardinality = iVar10;
              paVar8 = array_container_from_bitset((bitset_container_t *)local_50);
              uVar28 = local_54;
              uVar30 = local_58;
              uVar17 = local_5c;
            }
            else {
              local_5d = '\x01';
              local_50 = paVar25;
              if (uVar12 + 1 != uVar24) {
                uVar29 = -1L << (bVar9 & 0x3f);
                if (uVar11 - uVar30 == 0) {
                  uVar29 = (uVar29 << (~bVar27 & 0x3f)) >> (~bVar27 & 0x3f);
                  uVar22 = (ulong)uVar30;
                }
                else {
                  *(ulong *)(prVar3 + (ulong)uVar30 * 2) =
                       *(ulong *)(prVar3 + (ulong)uVar30 * 2) & ~uVar29;
                  if (uVar30 + 1 < uVar11) {
                    memset(prVar3 + uVar7 * 2 + 2,0,(ulong)((uVar11 - uVar30) - 2) * 8 + 8);
                  }
                  uVar29 = 0xffffffffffffffff >> (~bVar27 & 0x3f);
                }
                *(ulong *)(prVar3 + uVar22 * 2) = *(ulong *)(prVar3 + uVar22 * 2) & ~uVar29;
              }
              local_50->cardinality = iVar10;
              paVar8 = local_50;
              uVar28 = local_54;
              uVar30 = local_58;
              uVar17 = local_5c;
            }
          }
          paVar25 = (array_container_t *)(r->high_low_container).containers[uVar33];
          if (paVar8 != paVar25) {
            container_free(paVar25,(r->high_low_container).typecodes[uVar33]);
          }
          if (paVar8 != (array_container_t *)0x0) {
            puVar4 = (r->high_low_container).keys;
            iVar10 = (int)local_40;
            puVar4[iVar10] = puVar4[uVar33];
            (r->high_low_container).containers[iVar10] = paVar8;
            (r->high_low_container).typecodes[iVar10] = local_5d;
            local_40 = (ulong)(iVar10 + 1);
          }
          uVar33 = uVar33 + 1;
          iVar10 = (r->high_low_container).size;
          uVar29 = local_40;
          uVar22 = uVar33;
        } while (((long)uVar33 < (long)iVar10) &&
                (uVar12 = (uint)(r->high_low_container).keys[uVar33], uVar12 <= local_44));
      }
    }
    iVar32 = (int)uVar22;
    if ((int)uVar29 < iVar32) {
      ra_shift_tail(&r->high_low_container,iVar10 - iVar32,(int)uVar29 - iVar32);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min,
                                        uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, (uint16_t)min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min =
            (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max =
            (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, (uint16_t)src);
        container_t *new_container;
        uint8_t new_type;
        new_container =
            container_remove_range(ra->containers[src], ra->typecodes[src],
                                   container_min, container_max, &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src], ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}